

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O2

void __thiscall
supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>::
SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char> *this,
          vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
          *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          char batchSize,InnerRegisterSupplier *registerSupplier)

{
  _Manager_type p_Var1;
  pointer pSVar2;
  size_t sVar3;
  pointer poVar4;
  size_t sVar5;
  char cVar6;
  undefined2 uVar7;
  size_type __n;
  KeyValue<char,_char> *pKVar8;
  KeyValue<char,_char> *pKVar9;
  uint i;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  char batchSize_local;
  size_t min;
  KeyValue<char,_char> minItem;
  bool hasMin;
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  frontLine;
  vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  writeBuffer;
  _Any_data local_c8;
  _Manager_type local_b8;
  _Invoker_type local_b0;
  ulong local_a0;
  anon_class_24_3_7a9e0d2b updateOnce;
  vector<char,_std::allocator<char>_> currentFrontPointers;
  shared_ptr<supermap::io::FileManager> local_58;
  anon_class_24_3_5b0b3c05 dropWriteBuffer;
  
  batchSize_local = batchSize;
  std::filesystem::__cxx11::path::path((path *)&currentFrontPointers,dataFileName,auto_format);
  local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = (_Manager_type)0x0;
  local_b0 = registerSupplier->_M_invoker;
  p_Var1 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_c8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_c8._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_b8 = p_Var1;
  }
  SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>::SingleFileIndexedStorage
            (&this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>,
             (path *)&currentFrontPointers,&local_58,(InnerRegisterSupplier *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::filesystem::__cxx11::path::~path((path *)&currentFrontPointers);
  (this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
  super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
  super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>._vptr_OrderedStorage =
       (_func_int **)&PTR_append_001f4c98;
  (this->super_Findable<supermap::KeyValue<char,_char>,_char>)._vptr_Findable =
       (_func_int **)&DAT_001f4ce0;
  __n = ((long)(newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(newer->
              super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x38;
  std::vector<char,_std::allocator<char>_>::vector
            (&currentFrontPointers,__n,(allocator_type *)&frontLine);
  updateOnce.currentFrontPointers._0_3_ = CONCAT12(0,(ushort)updateOnce.currentFrontPointers);
  std::
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  ::vector(&frontLine,__n,(value_type *)&updateOnce,(allocator_type *)&writeBuffer);
  lVar10 = 2;
  lVar13 = 0;
  lVar14 = 0;
  min = __n;
  while (bVar15 = __n != 0, __n = __n - 1, bVar15) {
    pSVar2 = (newer->
             super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    cVar6 = (**(code **)(*(long *)((long)&(pSVar2->
                                          super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                          ).
                                          super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                          .
                                          super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                          ._vptr_OrderedStorage + lVar13) + 8))
                      ((long)&(pSVar2->
                              super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                              ).super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                              _vptr_OrderedStorage + lVar13);
    poVar4 = frontLine.
             super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ('\0' < cVar6) {
      pSVar2 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (**(code **)(*(long *)((long)&(pSVar2->
                                            super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            ).
                                            super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            ._vptr_OrderedStorage + lVar13) + 0x20))
                        ((long)&(pSVar2->
                                super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                ).super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                _vptr_OrderedStorage + lVar13,0);
      if (*(char *)((long)&(poVar4->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload
                   + lVar10) == '\x01') {
        *(undefined1 *)
         ((long)&(poVar4->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>).
                 _M_payload.super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload
         + lVar10) = 0;
      }
      *(undefined2 *)((long)poVar4 + lVar10 + -2) = uVar7;
      *(undefined1 *)
       ((long)&(poVar4->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>)._M_payload
               .super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload + lVar10) =
           1;
      pSVar2 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      cVar6 = (**(code **)(*(long *)((long)&(pSVar2->
                                            super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            ).
                                            super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            ._vptr_OrderedStorage + lVar13) + 8))
                        ((long)&(pSVar2->
                                super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                ).super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                _vptr_OrderedStorage + lVar13);
      lVar14 = lVar14 + cVar6;
    }
    lVar13 = lVar13 + 0x38;
    lVar10 = lVar10 + 3;
  }
  (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
    super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
    super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.register_.
    super_StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>_>
    ._vptr_Cloneable[5])
            (&(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
              super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.register_,lVar14);
  updateOnce.currentFrontPointers = &currentFrontPointers;
  updateOnce.frontLine = &frontLine;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  updateOnce.newer = newer;
  std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>::
  reserve(&writeBuffer,(long)batchSize);
  dropWriteBuffer.batchSize = &batchSize_local;
  local_a0 = min & 0xffffffff;
  dropWriteBuffer.writeBuffer = &writeBuffer;
  dropWriteBuffer.this = this;
  while( true ) {
    min = 0;
    bVar15 = false;
    uVar12 = local_a0;
    while( true ) {
      sVar5 = min;
      i = (int)uVar12 - 1;
      if ((int)i < 0) break;
      uVar11 = (ulong)i;
      if (frontLine.
          super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar11].
          super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
          super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged == true) {
        sVar5 = uVar11;
        if (bVar15) {
          pKVar8 = std::optional<supermap::KeyValue<char,_char>_>::value
                             (frontLine.
                              super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar11);
          sVar3 = min;
          pKVar9 = std::optional<supermap::KeyValue<char,_char>_>::value
                             (frontLine.
                              super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + min);
          if (pKVar9->key <= pKVar8->key) {
            pKVar8 = std::optional<supermap::KeyValue<char,_char>_>::value
                               (frontLine.
                                super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar11);
            pKVar9 = std::optional<supermap::KeyValue<char,_char>_>::value
                               (frontLine.
                                super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + sVar3);
            sVar5 = min;
            if (pKVar8->key == pKVar9->key) {
              SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()(&updateOnce,i);
              sVar5 = min;
            }
          }
        }
        else {
          bVar15 = true;
        }
      }
      min = sVar5;
      uVar12 = uVar12 - 1;
    }
    if (!bVar15) break;
    pKVar8 = std::optional<supermap::KeyValue<char,_char>_>::value
                       (frontLine.
                        super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + min);
    minItem = *pKVar8;
    SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()(&updateOnce,(int32_t)sVar5)
    ;
    std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>::
    emplace_back<supermap::KeyValue<char,char>>
              ((vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>
                *)&writeBuffer,&minItem);
    if (batchSize_local <=
        (char)((uint)((int)writeBuffer.
                           super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (int)writeBuffer.
                          super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 1)) {
      SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()(&dropWriteBuffer);
    }
  }
  SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()(&dropWriteBuffer);
  std::
  _Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>::
  ~_Vector_base(&writeBuffer.
                 super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
               );
  std::
  _Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  ::~_Vector_base(&frontLine.
                   super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                 );
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&currentFrontPointers.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }